

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  io_context io_context;
  io_context iStack_18;
  
  boost::asio::io_context::io_context(&iStack_18);
  boost::asio::io_context::run(&iStack_18);
  poVar1 = std::operator<<((ostream *)&std::cout,"Hello, World!");
  std::endl<char,std::char_traits<char>>(poVar1);
  boost::asio::execution_context::~execution_context(&iStack_18.super_execution_context);
  return 0;
}

Assistant:

int main() {
  boost::asio::io_context io_context;
  io_context.run();

  std::cout << "Hello, World!" << std::endl;

  return 0;
}